

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_md2012.c
# Opt level: O0

int gost_digest_ctrl_256(EVP_MD_CTX *ctx,int type,int arg,void *ptr)

{
  void *pvVar1;
  long *in_RCX;
  int in_ESI;
  int local_4;
  
  if (in_ESI == 2) {
    pvVar1 = CRYPTO_malloc(0x13,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_md2012.c"
                           ,0x6c);
    *in_RCX = (long)pvVar1;
    if (*in_RCX == 0) {
      local_4 = 0;
    }
    else {
      strcpy((char *)*in_RCX,"gostr3411-2012-256");
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int gost_digest_ctrl_256(EVP_MD_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_MD_CTRL_MICALG:
        {
            *((char **)ptr) = OPENSSL_malloc(strlen(micalg_256) + 1);
            if (*((char **)ptr) != NULL) {
                strcpy(*((char **)ptr), micalg_256);
                return 1;
            }
            return 0;
        }
    default:
        return 0;
    }
}